

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

void panic(char *filename,int line,char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  char *pcVar2;
  char *in_RDX;
  char *pcVar3;
  uint in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char buffer [1000];
  va_list args;
  undefined1 auStack_4d8 [24];
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  char local_428 [1008];
  undefined4 local_38;
  undefined4 local_34;
  undefined1 *local_30;
  undefined1 *local_28;
  char *local_18;
  uint local_c;
  undefined8 local_8;
  
  local_28 = auStack_4d8;
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  local_30 = &stack0x00000008;
  local_34 = 0x30;
  local_38 = 0x18;
  pcVar3 = "";
  if (panic_use_colours) {
    pcVar3 = "\x1b[35m";
  }
  pcVar2 = "";
  if (panic_use_colours) {
    pcVar2 = "\x1b[0m";
  }
  local_4c0 = in_RCX;
  local_4b8 = in_R8;
  local_4b0 = in_R9;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  sprintf(local_428,"%sCGREEN EXCEPTION%s: <%s:%d>",pcVar3,pcVar2,in_RDI,(ulong)in_ESI);
  sVar1 = strlen(local_428);
  vsprintf(local_428 + sVar1,local_18,&local_38);
  if (panic_message_buffer == (char *)0x0) {
    fprintf(_stderr,"%s\n",local_428);
  }
  else {
    strcpy(panic_message_buffer,local_428);
  }
  return;
}

Assistant:

void panic(const char *filename, int line, const char *fmt, ...) {
    va_list args;
    char buffer[1000];

    va_start(args, fmt);
    sprintf(buffer, "%sCGREEN EXCEPTION%s: <%s:%d>",
            panic_use_colours?MAGENTA:"",
            panic_use_colours?RESET:"",
            filename, line);
    vsprintf(&buffer[strlen(buffer)], fmt, args);
    va_end(args);

    if (panic_message_buffer != NULL)
        strcpy(panic_message_buffer, buffer);
    else
        fprintf(stderr, "%s\n", buffer);
}